

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  SrcList *pSVar1;
  RenameCtx *pCtx;
  int iVar2;
  long lVar3;
  Table **ppTVar4;
  
  if ((pSelect->selFlags & 0x4200000) != 0) {
    return 1;
  }
  pSVar1 = pSelect->pSrc;
  if (pSVar1 == (SrcList *)0x0) {
    iVar2 = 2;
  }
  else {
    pCtx = (pWalker->u).pRename;
    ppTVar4 = &pSVar1->a[0].pSTab;
    for (lVar3 = 0; lVar3 < pSVar1->nSrc; lVar3 = lVar3 + 1) {
      if (*ppTVar4 == pCtx->pTab) {
        renameTokenFind(pWalker->pParse,pCtx,((SrcItem *)(ppTVar4 + -2))->zName);
      }
      ppTVar4 = ppTVar4 + 9;
    }
    renameWalkWith(pWalker,pSelect);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  if( pSelect->selFlags & (SF_View|SF_CopyCte) ){
    testcase( pSelect->selFlags & SF_View );
    testcase( pSelect->selFlags & SF_CopyCte );
    return WRC_Prune;
  }
  if( NEVER(pSrc==0) ){
    assert( pWalker->pParse->db->mallocFailed );
    return WRC_Abort;
  }
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *pItem = &pSrc->a[i];
    if( pItem->pSTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }
  renameWalkWith(pWalker, pSelect);

  return WRC_Continue;
}